

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

JPPV_sharedPtr __thiscall
JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector
          (JointPolicyPureVectorForClusteredBG *this)

{
  int *piVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  size_type __n;
  sp_counted_base *psVar3;
  size_t sVar4;
  bool bVar5;
  element_type *peVar6;
  sp_counted_base *psVar7;
  JointPolicyPureVectorForClusteredBG *pJVar8;
  JointPolicyPureVector *this_00;
  ulong uVar9;
  shared_count extraout_RDX;
  JointPolicyPureVectorForClusteredBG *in_RSI;
  Interface_ProblemToPolicyDiscretePure *pu;
  Index ts;
  ulong uVar10;
  JPPV_sharedPtr JVar11;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  jpolBGVec;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  bgVec;
  undefined1 local_c8 [24];
  JointPolicyPureVectorForClusteredBG *local_b0;
  shared_ptr<const_BayesianGameWithClusterInfo> local_a8;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_> local_98
  ;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_80;
  element_type *local_68;
  shared_count sStack_60;
  PlanningUnitDecPOMDPDiscrete *local_58;
  JointPolicyPureVectorForClusteredBG *local_50;
  JPPV_sharedPtr local_48;
  
  pPVar2 = (((in_RSI->_m_bg).px)->super_BayesianGameForDecPOMDPStage)._m_pu;
  this_00 = (JointPolicyPureVector *)operator_new(0x98);
  pu = &(pPVar2->super_PlanningUnitMADPDiscrete).super_Interface_ProblemToPolicyDiscretePure;
  if (pPVar2 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pu = (Interface_ProblemToPolicyDiscretePure *)0x0;
  }
  JointPolicyPureVector::JointPolicyPureVector(this_00,pu,OHIST_INDEX);
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
            ((shared_ptr<JointPolicyPureVector> *)this,this_00);
  __n = (pPVar2->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  local_a8.px = (element_type *)0x0;
  local_a8.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = this;
  std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
  vector(&local_98,__n,(allocator_type *)&local_80);
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::vector(&local_80,__n,(allocator_type *)&local_68);
  local_58 = pPVar2;
  local_50 = in_RSI;
  if (__n == 0) {
    ts = 0;
  }
  else {
    uVar9 = 0;
    uVar10 = 1;
    do {
      psVar3 = (in_RSI->_m_bg).pn.pi_;
      peVar6 = (in_RSI->_m_bg).px;
      psVar7 = (in_RSI->_m_bg).pn.pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar3->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_c8._0_16_ = ZEXT816(0);
      local_68 = local_a8.px;
      sStack_60.pi_ = local_a8.pn.pi_;
      local_a8.px = peVar6;
      local_a8.pn.pi_ = psVar7;
      boost::detail::shared_count::~shared_count(&sStack_60);
      boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 8));
      ts = (Index)(~uVar9 + __n);
      uVar9 = ~uVar9 + __n & 0xffffffff;
      if (((ulong)((long)local_98.
                         super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.
                         super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9) ||
         (local_98.
          super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9] = (JointPolicyDiscretePure *)in_RSI,
         (ulong)((long)local_80.
                       super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.
                       super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar9)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
                (local_80.
                 super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar9,&local_a8);
      if ((ts != 0) &&
         (in_RSI = (in_RSI->_m_prevJPolBG).px, in_RSI == (JointPolicyPureVectorForClusteredBG *)0x0)
         ) {
        psVar3 = ((local_a8.px)->super_BayesianGameForDecPOMDPStage).
                 super_BayesianGameForDecPOMDPStageInterface._m_pJPol.pn.pi_;
        local_68 = (element_type *)
                   ((local_a8.px)->super_BayesianGameForDecPOMDPStage).
                   super_BayesianGameForDecPOMDPStageInterface._m_pJPol.px;
        sStack_60.pi_ =
             ((local_a8.px)->super_BayesianGameForDecPOMDPStage).
             super_BayesianGameForDecPOMDPStageInterface._m_pJPol.pn.pi_;
        if (psVar3 != (sp_counted_base *)0x0) {
          LOCK();
          piVar1 = &psVar3->use_count_;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_c8._0_16_ = ZEXT816(0) << 0x20;
        boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 8));
        pJVar8 = local_b0;
        (*(local_68->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface
          ._vptr_BayesianGameForDecPOMDPStageInterface[0x14])(local_c8);
        JointPolicyPureVector::operator=
                  ((JointPolicyPureVector *)
                   (pJVar8->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure
                   .super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy.
                   _vptr_JointPolicy,(JointPolicyPureVector *)local_c8._0_8_);
        boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 8));
        boost::detail::shared_count::~shared_count(&sStack_60);
        break;
      }
      bVar5 = uVar10 < __n;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar5);
  }
  pJVar8 = local_b0;
  sVar4 = (local_b0->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
          super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
  local_48.px = (element_type *)
                (local_b0->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
                super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy.
                _vptr_JointPolicy;
  local_48.pn.pi_ =
       (sp_counted_base *)
       (local_b0->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
       super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
  if (sVar4 != 0) {
    LOCK();
    piVar1 = (int *)(sVar4 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  StartRecursiveConstructionPerAgent(local_50,local_58,&local_48,ts,&local_98,&local_80);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::~vector(&local_80);
  if (local_98.
      super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  boost::detail::shared_count::~shared_count(&local_a8.pn);
  JVar11.pn.pi_ = extraout_RDX.pi_;
  JVar11.px = (element_type *)pJVar8;
  return JVar11;
}

Assistant:

JPPV_sharedPtr 
JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector() const
{
#if DEBUG_TOJPPV
    cout << ">>>JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector() started"<<endl;
#endif
    const PlanningUnitDecPOMDPDiscrete* pu = _m_bg->GetPUDecPOMDPDiscrete();
    JPPV_sharedPtr jppv = 
        JPPV_sharedPtr(
            new JointPolicyPureVector(pu, PolicyGlobals::OHIST_INDEX ));

    size_t h = pu->GetHorizon();
    
    const JointPolicyPureVectorForClusteredBG* jpolBG = this;
    BGwCI_constPtr bg;
    vector<const JointPolicyDiscretePure* > jpolBGVec(h);
    vector<BGwCI_constPtr> bgVec(h);
    Index t=0;
    //for(t=h-1; t >= 0; t--) //<- this never terminates (t is unsigned)
    for(Index t_inv = 0; t_inv < h; t_inv++)
    {
        t = h - 1 - t_inv;
        bg =  jpolBG->GetBG();
#if DEBUG_TOJPPV
        cout << ">>>t="<<t<<" jpolBG: "<< endl<< jpolBG->SoftPrint() <<endl;
        cout << ">>>corresponding BG:" << endl << bg->SoftPrint() << endl;
#endif
        jpolBGVec.at(t) = jpolBG;
        bgVec.at(t) = bg;
        if( t > 0  )
        {
            jpolBG = jpolBG->_m_prevJPolBG.get();
            if(jpolBG == 0)
            {
#if DEBUG_TOJPPV
                cout << ">>>t=" << t
                     << "apparently for stages 0...t a different type of policy is used" << endl;
#endif
                //apparently for stages 0...t a different type of policy is used
                //we get it from the BG:
                boost::shared_ptr<const JointPolicyDiscretePure> jp = bg->GetPastJointPolicy();
                *jppv = *(jp->ToJointPolicyPureVector());
                break;
            }
        }
    }
    // 
#if DEBUG_TOJPPV
    cout << ">>>About to start StartRecursiveConstructionPerAgent... t="<<t<<endl;
#endif

    StartRecursiveConstructionPerAgent(pu, jppv, t, jpolBGVec, bgVec);
    return jppv;

}